

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# descriptor.cc
# Opt level: O2

void __thiscall
google::protobuf::FileDescriptor::CopySourceCodeInfoTo
          (FileDescriptor *this,FileDescriptorProto *proto)

{
  SourceCodeInfo *from;
  SourceCodeInfo *this_00;
  
  from = this->source_code_info_;
  if (from == (SourceCodeInfo *)_SourceCodeInfo_default_instance_ || from == (SourceCodeInfo *)0x0)
  {
    return;
  }
  this_00 = FileDescriptorProto::mutable_source_code_info(proto);
  SourceCodeInfo::CopyFrom(this_00,from);
  return;
}

Assistant:

void FileDescriptor::CopySourceCodeInfoTo(FileDescriptorProto* proto) const {
  if (source_code_info_ &&
      source_code_info_ != &SourceCodeInfo::default_instance()) {
    *proto->mutable_source_code_info() = *source_code_info_;
  }
}